

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoffInterface.h
# Opt level: O2

void __thiscall
BayesianGameIdenticalPayoffInterface::Print(BayesianGameIdenticalPayoffInterface *this)

{
  string asStack_28 [32];
  
  (*(this->super_BayesianGameBase).super_Interface_ProblemToPolicyDiscretePure.
    super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[0x12])
            (asStack_28,this);
  std::operator<<((ostream *)&std::cout,asStack_28);
  std::__cxx11::string::~string(asStack_28);
  return;
}

Assistant:

virtual void Print() const
        { std::cout << SoftPrint();}